

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

void (anonymous_namespace)::
     roundtrip_into<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *in,vector<int,_std::allocator<int>_> *out)

{
  long lVar1;
  Result *in_R9;
  InputStream istream;
  OutputStream ostream;
  stringstream stream;
  undefined1 auStack_1e8 [4];
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  Expression_lhs<unsigned_long> local_1d8;
  Result local_1c8;
  OutputStream local_1a8;
  long local_1a0 [3];
  undefined4 auStack_184 [25];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  *(undefined4 *)((long)auStack_184 + lVar1) = 4;
  std::ios::clear((int)auStack_1e8 + (int)lVar1 + 0x48);
  local_1a8.stream = (stringstream *)local_1a0;
  mserialize::detail::BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::
  serialize<OutputStream>(in,&local_1a8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_1d8.lhs = std::ostream::tellp();
  local_1d8.m_at = local_1e4.m_at;
  local_1e0 = (long)(in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish +
              (4 - (long)(in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start);
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1c8,&local_1d8,&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b828c,(char *)0x36,0x1b84ed,&local_1c8.m_passed,in_R9);
  doctest::String::~String(&local_1c8.m_decomp);
  local_1d8.lhs = (unsigned_long)local_1a0;
  mserialize::detail::BuiltinDeserializer<std::vector<int,_std::allocator<int>_>,_void>::
  deserialize<InputStream>(out,(InputStream *)&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void roundtrip_into(const In& in, Out& out)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // make sure computed serialized size is correct
  CHECK(std::size_t(stream.tellp()) == mserialize::serialized_size(in));

  // deserialize
  InputStream istream{stream};
  mserialize::deserialize(out, istream);
}